

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O2

void __thiscall
TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>_>::SetFreeIntPtIndices
          (TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>_> *this)

{
  TPZMaterial *pTVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  
  pTVar1 = TPZCompEl::Material((TPZCompEl *)this);
  if (pTVar1 != (TPZMaterial *)0x0) {
    plVar2 = (long *)__dynamic_cast(pTVar1,&TPZMaterial::typeinfo,&TPZMatWithMemBase::typeinfo,
                                    0xfffffffffffffffe);
    if (plVar2 != (long *)0x0) {
      lVar4 = (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNElements;
      lVar3 = 0;
      if (lVar4 < 1) {
        lVar4 = lVar3;
      }
      for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
        (**(code **)(*plVar2 + 0x60))(plVar2);
      }
    }
  }
  TPZManVector<long,_128>::Resize(&(this->fIntPtIndices).super_TPZManVector<long,_128>,0);
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::SetFreeIntPtIndices() {
    
    TPZMaterial * material = TBASE::Material();
    auto * matWithMem =
        dynamic_cast<TPZMatWithMemBase *>(material);
    if (matWithMem) {
        int64_t n = fIntPtIndices.NElements();
        
        for (int64_t i = 0; i < n; i++) {
            matWithMem->FreeMemItem(fIntPtIndices[i]);
        }
    }
    fIntPtIndices.Resize(0);
}